

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall
cmTarget::StrictTargetComparison::operator()(StrictTargetComparison *this,cmTarget *t1,cmTarget *t2)

{
  char *__s1;
  int iVar1;
  string *psVar2;
  
  iVar1 = strcmp((t1->Name)._M_dataplus._M_p,(t2->Name)._M_dataplus._M_p);
  if (iVar1 == 0) {
    psVar2 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(t1->Makefile);
    __s1 = (psVar2->_M_dataplus)._M_p;
    psVar2 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(t2->Makefile);
    iVar1 = strcmp(__s1,(psVar2->_M_dataplus)._M_p);
  }
  return SUB41((uint)iVar1 >> 0x1f,0);
}

Assistant:

bool cmTarget::StrictTargetComparison::operator()(cmTarget const* t1,
                                                  cmTarget const* t2) const
{
  int nameResult = strcmp(t1->GetName().c_str(), t2->GetName().c_str());
  if (nameResult == 0) {
    return strcmp(t1->GetMakefile()->GetCurrentBinaryDirectory().c_str(),
                  t2->GetMakefile()->GetCurrentBinaryDirectory().c_str()) < 0;
  }
  return nameResult < 0;
}